

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

bool __thiscall
capnp::SchemaLoader::CompatibilityChecker::canUpgradeToAnyPointer
          (CompatibilityChecker *this,Reader *type)

{
  Which WVar1;
  uint uVar2;
  Reader *type_local;
  CompatibilityChecker *this_local;
  
  WVar1 = capnp::schema::Type::Reader::which(type);
  uVar2 = (uint)WVar1;
  if (WVar1 < TEXT) {
LAB_00214f5b:
    this_local._7_1_ = false;
  }
  else {
    if (2 < uVar2 - 0xc) {
      if (uVar2 == 0xf) goto LAB_00214f5b;
      if (2 < uVar2 - 0x10) {
        return true;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool canUpgradeToAnyPointer(const schema::Type::Reader& type) {
    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::ENUM:
        return false;

      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        return true;
    }

    // Be lenient with unknown types.
    return true;
  }